

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O3

error<idx2::idx2_err_code> idx2::FlushChunkExponents(idx2_file *Idx2,encode_data *E)

{
  int iVar1;
  array<idx2::sub_channel_info> *Array;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  sub_channel_info *Beg;
  ulong uVar8;
  allocator *paVar9;
  undefined1 auVar10 [16];
  long lVar11;
  long lVar12;
  ulong *puVar13;
  long lVar14;
  FILE *__s;
  size_t sVar15;
  u64 *puVar16;
  int iVar17;
  i64 iVar18;
  i8 in_R9B;
  long lVar19;
  sub_channel *psVar20;
  chunk_exp_info *pcVar21;
  long lVar22;
  int iVar23;
  byte *pbVar24;
  byte *pbVar25;
  long *in_FS_OFFSET;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 uVar29;
  undefined1 in_ZMM2 [64];
  undefined8 in_XMM4_Qb;
  stref sVar30;
  file_id FileId;
  anon_union_8_2_2df48d06_for_stref_0 local_90;
  long local_88;
  allocator *local_80;
  encode_data *local_78;
  bitstream *local_70;
  array<unsigned_char> *local_68;
  size_t local_60;
  anon_union_8_2_2df48d06_for_stref_0 local_58;
  undefined4 local_50;
  anon_union_8_2_2df48d06_for_stref_0 local_48 [3];
  
  lVar22 = -0x8000000000000000;
  Array = &E->SortedSubChannels;
  GrowCapacity<idx2::sub_channel_info>(Array,(E->SubChannels).Size);
  (E->SortedSubChannels).Size = 0;
  lVar14 = (E->SubChannels).LogCapacity;
  lVar12 = 1L << ((byte)lVar14 & 0x3f);
  lVar19 = -0x8000000000000000;
  if (lVar14 == 0x3f) {
LAB_001986fd:
    if (lVar19 == lVar12) {
      iVar18 = 0;
    }
    else {
      psVar20 = (E->SubChannels).Vals + lVar19;
      puVar13 = (E->SubChannels).Keys + lVar19;
      do {
        uVar8 = *puVar13;
        lVar14 = (E->SortedSubChannels).Size;
        if ((E->SortedSubChannels).Capacity <= lVar14) {
          GrowCapacity<idx2::sub_channel_info>(Array,0);
          lVar14 = (E->SortedSubChannels).Size;
        }
        (E->SortedSubChannels).Size = lVar14 + 1;
        pbVar24 = (E->SortedSubChannels).Buffer.Data;
        lVar14 = lVar14 * 0x10;
        pbVar24[lVar14] = (byte)(uVar8 >> 0x3c);
        pbVar24[lVar14 + 1] = (byte)(uVar8 >> 0xc) & 0x3f;
        *(sub_channel **)(pbVar24 + lVar14 + 8) = psVar20;
        lVar14 = lVar19 * -0x70;
        lVar12 = lVar19 * -8;
        do {
          lVar14 = lVar14 + -0x70;
          lVar12 = lVar12 + -8;
          lVar11 = lVar19 + 1;
          lVar19 = lVar19 + 1;
        } while ((E->SubChannels).Stats[lVar11] != Occupied);
        puVar13 = (ulong *)((long)(E->SubChannels).Keys - lVar12);
        psVar20 = (sub_channel *)((long)(E->SubChannels).Vals - lVar14);
      } while (1L << ((byte)(E->SubChannels).LogCapacity & 0x3f) != lVar19);
      iVar18 = (E->SortedSubChannels).Size;
    }
  }
  else {
    iVar18 = 0;
    lVar14 = 0;
    if (0 < lVar12) {
      lVar14 = lVar12;
    }
    lVar19 = 0;
    do {
      if ((E->SubChannels).Stats[lVar19] == Occupied) goto LAB_001986fd;
      lVar19 = lVar19 + 1;
    } while (lVar14 + 1 != lVar19);
  }
  Beg = (sub_channel_info *)(E->SortedSubChannels).Buffer.Data;
  InsertionSort<idx2::sub_channel_info*>(Beg,Beg + iVar18);
  if ((E->SortedSubChannels).Size != 0) {
    pbVar24 = (Array->Buffer).Data;
    do {
      WriteChunkExponents((idx2 *)Idx2,(idx2_file *)E,*(encode_data **)(pbVar24 + 8),
                          (sub_channel *)(ulong)(uint)(int)(char)*pbVar24,pbVar24[1],in_R9B);
      pbVar24 = pbVar24 + 0x10;
    } while (pbVar24 != (E->SortedSubChannels).Buffer.Data + (E->SortedSubChannels).Size * 0x10);
  }
  lVar19 = (E->ChunkExponents).LogCapacity;
  lVar14 = 1L << ((byte)lVar19 & 0x3f);
  if (lVar19 == 0x3f) {
LAB_00198864:
    if (lVar22 != lVar14) {
      pcVar21 = (E->ChunkExponents).Vals + lVar22;
      puVar16 = (E->ChunkExponents).Keys + lVar22;
      local_70 = &E->CompressedChunkAddresses;
      local_78 = E;
      do {
        uVar29 = in_ZMM2._8_8_;
        ConstructFilePath((file_id *)local_48,Idx2,*puVar16);
        __s = fopen(local_48[0].Ptr,"ab");
        if (__s == (FILE *)0x0) {
          local_58.Ptr = local_48[0].Ptr;
          sVar15 = strlen(local_48[0].Ptr);
          local_50 = (undefined4)sVar15;
          sVar30 = GetParentPath((stref *)&local_58);
          local_90 = sVar30.field_0;
          local_88 = CONCAT44(local_88._4_4_,sVar30.Size);
          CreateFullDir((stref *)&local_90);
          __s = fopen(local_48[0].Ptr,"ab");
        }
        puVar13 = (ulong *)(pcVar21->ExpSizes).BitPtr;
        uVar8 = (pcVar21->ExpSizes).BitBuf;
        *puVar13 = uVar8;
        uVar7 = (pcVar21->ExpSizes).BitPos;
        if (0 < (int)uVar7 >> 3) {
          (pcVar21->ExpSizes).BitBuf = (uVar8 >> 1) >> (((byte)uVar7 & 0xf8) - 1 & 0x3f);
        }
        pbVar24 = (byte *)((long)puVar13 + (long)((int)uVar7 >> 3));
        (pcVar21->ExpSizes).BitPtr = pbVar24;
        (pcVar21->ExpSizes).BitPos = uVar7 & 7;
        auVar26._0_8_ =
             (double)(long)(pbVar24 +
                           ((ulong)((uVar7 & 7) != 0) - (long)(pcVar21->ExpSizes).Stream.Data));
        auVar26._8_8_ = uVar29;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = _ZN4idx2L17ExpChunkSizesStatE_0;
        auVar10 = vminsd_avx(auVar26,auVar2);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = _ZN4idx2L17ExpChunkSizesStatE_1;
        auVar2 = vmaxsd_avx(auVar26,auVar3);
        in_ZMM2 = ZEXT1664(auVar2);
        _ZN4idx2L17ExpChunkSizesStatE_2 = auVar26._0_8_ + _ZN4idx2L17ExpChunkSizesStatE_2;
        _ZN4idx2L17ExpChunkSizesStatE_0 = auVar10._0_8_;
        _ZN4idx2L17ExpChunkSizesStatE_3 = _ZN4idx2L17ExpChunkSizesStatE_3 + 1;
        _ZN4idx2L17ExpChunkSizesStatE_1 = auVar2._0_8_;
        _ZN4idx2L17ExpChunkSizesStatE_4 =
             auVar26._0_8_ * auVar26._0_8_ + _ZN4idx2L17ExpChunkSizesStatE_4;
        local_60 = (pcVar21->FileExpBuffer).Size;
        fwrite((pcVar21->FileExpBuffer).Buffer.Data,local_60,1,__s);
        pbVar24 = (pcVar21->ExpSizes).Stream.Data;
        iVar17 = (pcVar21->ExpSizes).BitPos;
        iVar1 = iVar17 + 7;
        iVar17 = iVar17 + 0xe;
        if (-1 < iVar1) {
          iVar17 = iVar1;
        }
        pbVar25 = (pcVar21->ExpSizes).BitPtr + ((long)(iVar17 >> 3) - (long)pbVar24);
        fwrite(pbVar24,(size_t)pbVar25,1,__s);
        iVar23 = (int)pbVar25;
        local_90._0_4_ = iVar23;
        fwrite(&local_90,4,1,__s);
        local_88 = (pcVar21->Addrs).Size << 3;
        auVar27._0_8_ = (double)local_88;
        auVar27._8_8_ = in_XMM4_Qb;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = _ZN4idx2L33UncompressedExpChunkAddressesStatE_0;
        auVar2 = vminsd_avx(auVar27,auVar10);
        _ZN4idx2L33UncompressedExpChunkAddressesStatE_0 = auVar2._0_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = _ZN4idx2L33UncompressedExpChunkAddressesStatE_1;
        auVar2 = vmaxsd_avx(auVar27,auVar4);
        _ZN4idx2L33UncompressedExpChunkAddressesStatE_1 = auVar2._0_8_;
        _ZN4idx2L33UncompressedExpChunkAddressesStatE_2 =
             auVar27._0_8_ + _ZN4idx2L33UncompressedExpChunkAddressesStatE_2;
        _ZN4idx2L33UncompressedExpChunkAddressesStatE_3 =
             _ZN4idx2L33UncompressedExpChunkAddressesStatE_3 + 1;
        _ZN4idx2L33UncompressedExpChunkAddressesStatE_4 =
             auVar27._0_8_ * auVar27._0_8_ + _ZN4idx2L33UncompressedExpChunkAddressesStatE_4;
        local_90 = (anon_union_8_2_2df48d06_for_stref_0)(pcVar21->Addrs).Buffer.Data;
        local_80 = (pcVar21->Addrs).Buffer.Alloc;
        CompressBufZstd((buffer *)&local_90,local_70);
        pbVar24 = (local_78->CompressedChunkAddresses).Stream.Data;
        iVar17 = (local_78->CompressedChunkAddresses).BitPos;
        iVar1 = iVar17 + 7;
        iVar17 = iVar17 + 0xe;
        if (-1 < iVar1) {
          iVar17 = iVar1;
        }
        pbVar25 = (local_78->CompressedChunkAddresses).BitPtr +
                  ((long)(iVar17 >> 3) - (long)pbVar24);
        auVar28._0_8_ = (double)(long)pbVar25;
        auVar28._8_8_ = in_XMM4_Qb;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = _ZN4idx2L31CompressedExpChunkAddressesStatE_0;
        auVar2 = vminsd_avx(auVar28,auVar5);
        _ZN4idx2L31CompressedExpChunkAddressesStatE_0 = auVar2._0_8_;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = _ZN4idx2L31CompressedExpChunkAddressesStatE_1;
        auVar2 = vmaxsd_avx(auVar28,auVar6);
        local_68 = &pcVar21->FileExpBuffer;
        _ZN4idx2L31CompressedExpChunkAddressesStatE_1 = auVar2._0_8_;
        _ZN4idx2L31CompressedExpChunkAddressesStatE_2 =
             auVar28._0_8_ + _ZN4idx2L31CompressedExpChunkAddressesStatE_2;
        _ZN4idx2L31CompressedExpChunkAddressesStatE_3 =
             _ZN4idx2L31CompressedExpChunkAddressesStatE_3 + 1;
        _ZN4idx2L31CompressedExpChunkAddressesStatE_4 =
             auVar28._0_8_ * auVar28._0_8_ + _ZN4idx2L31CompressedExpChunkAddressesStatE_4;
        fwrite(pbVar24,(size_t)pbVar25,1,__s);
        local_90._0_4_ = (int)pbVar25;
        fwrite(&local_90,4,1,__s);
        local_90._0_4_ = (undefined4)(pcVar21->Addrs).Size;
        fwrite(&local_90,4,1,__s);
        local_90._0_4_ = iVar23 + (int)local_60 + (int)pbVar25 + 0x10;
        fwrite(&local_90,4,1,__s);
        paVar9 = (pcVar21->FileExpBuffer).Alloc;
        (*paVar9->_vptr_allocator[1])(paVar9,local_68);
        (pcVar21->FileExpBuffer).Size = 0;
        (pcVar21->FileExpBuffer).Capacity = 0;
        if (__s != (FILE *)0x0) {
          fclose(__s);
        }
        lVar19 = lVar22 * -0x90;
        lVar14 = lVar22 * -8;
        do {
          lVar19 = lVar19 + -0x90;
          lVar14 = lVar14 + -8;
          lVar12 = lVar22 + 1;
          lVar22 = lVar22 + 1;
        } while ((local_78->ChunkExponents).Stats[lVar12] != Occupied);
        puVar16 = (u64 *)((long)(local_78->ChunkExponents).Keys - lVar14);
        pcVar21 = (chunk_exp_info *)((long)(local_78->ChunkExponents).Vals - lVar19);
      } while (1L << ((byte)(local_78->ChunkExponents).LogCapacity & 0x3f) != lVar22);
    }
  }
  else {
    lVar22 = 0;
    lVar19 = 0;
    if (0 < lVar14) {
      lVar19 = lVar14;
    }
    do {
      if ((E->ChunkExponents).Stats[lVar22] == Occupied) goto LAB_00198864;
      lVar22 = lVar22 + 1;
    } while (lVar19 + 1 != lVar22);
  }
  *(char **)(*in_FS_OFFSET + -0xb80) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xcb;
  return (error<idx2::idx2_err_code>)ZEXT816(0x1bd78d);
}

Assistant:

error<idx2_err_code>
FlushChunkExponents(const idx2_file& Idx2, encode_data* E)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    Reserve(&E->SortedSubChannels, Size(E->SubChannels));
    Clear(&E->SortedSubChannels);
    idx2_ForEach (Sch, E->SubChannels)
    {
      sub_channel_info ScInfo;
      ScInfo.SubChannel = &*Sch;
      u64 Brick;
      i16 BitPlane;
      UnpackFileAddress(Idx2, *Sch.Key, &Brick, &ScInfo.Level, &ScInfo.Subband, &BitPlane);
      PushBack(&E->SortedSubChannels, ScInfo);
    }
    InsertionSort(Begin(E->SortedSubChannels), End(E->SortedSubChannels));

    idx2_ForEach (Sch, E->SortedSubChannels)
      WriteChunkExponents(Idx2, E, Sch->SubChannel, Sch->Level, Sch->Subband); //just call  WriteChunkExponents

    return idx2_Error(idx2_err_code::NoError);
  }
#endif

  Reserve(&E->SortedSubChannels, Size(E->SubChannels));
  Clear(&E->SortedSubChannels);
  idx2_ForEach (Sch, E->SubChannels)
  {
    sub_channel_info ScInfo;
    ScInfo.SubChannel = &*Sch;
    u64 Brick;
    i16 BitPlane;
    UnpackFileAddress(Idx2, *Sch.Key, &Brick, &ScInfo.Level, &ScInfo.Subband, &BitPlane);
    PushBack(&E->SortedSubChannels, ScInfo);
  }
  InsertionSort(Begin(E->SortedSubChannels), End(E->SortedSubChannels));

  idx2_ForEach (Sch, E->SortedSubChannels)
    WriteChunkExponents(Idx2, E, Sch->SubChannel, Sch->Level, Sch->Subband);
  // TODO: deallocate the file emax buffer after it is flushed to a file
  // TODO: need to "interleave" this with FlushChunk
  // TODO: detect that we are done with a file to flush it as soon as possible instead of at the end (maybe count the number of chunks in a file)
  // TODO: as soon as we get out of a spatial domain for a file, flush every files in the buffer
  // (since we know that all files in the buffer cannot be traversed again in the spatial DFS order)
  idx2_ForEach (CeIt, E->ChunkExponents) // one CeIt for each file
  {
    chunk_exp_info* Ce = CeIt.Val;
    bitstream* ChunkExpSizes = &Ce->ExpSizes;
    file_id FileId = ConstructFilePath(Idx2, *CeIt.Key);
    idx2_Assert(FileId.Id == *CeIt.Key);
    /* write chunk emax sizes */
    idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
    Flush(ChunkExpSizes);
    ExpChunkSizesStat.Add((f64)Size(*ChunkExpSizes));
    int TotalExpBytes = 0;
    // write the exponent buffer
    buffer Buf = ToBuffer(Ce->FileExpBuffer);
    WriteBuffer(Fp, Buf);
    TotalExpBytes += int(Buf.Bytes);
    // write the (compressed) sizes of the exponents
    Buf = ToBuffer(*ChunkExpSizes);
    WriteBuffer(Fp, Buf);
    WritePOD(Fp, (int)Buf.Bytes);
    TotalExpBytes += int(Buf.Bytes) + sizeof(int);
    // write compressed chunk addresses
    UncompressedExpChunkAddressesStat.Add((f64)Size(ToBuffer(Ce->Addrs)));
    CompressBufZstd(ToBuffer(Ce->Addrs), &E->CompressedChunkAddresses);
    CompressedExpChunkAddressesStat.Add((f64)Size(E->CompressedChunkAddresses));
    Buf = ToBuffer(E->CompressedChunkAddresses);
    WriteBuffer(Fp, Buf);
    WritePOD(Fp, (int)Buf.Bytes);
    TotalExpBytes += int(Buf.Bytes) + sizeof(int);
    // write number of chunks
    WritePOD(Fp, (int)Size(Ce->Addrs));
    TotalExpBytes += sizeof(int);
    // write the total number of bytes used for storing the exponents
    TotalExpBytes += sizeof(int);
    WritePOD(Fp, (int)TotalExpBytes);
    Dealloc(&CeIt.Val->FileExpBuffer);
  }

  return idx2_Error(idx2_err_code::NoError);
}